

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Downloader.cpp
# Opt level: O2

void __thiscall Downloader::calculateTimeRemaining(Downloader *this,qint64 received,qint64 total)

{
  uint uVar1;
  QLabel *pQVar2;
  double dVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  int iVar7;
  long lVar8;
  QArrayDataPointer<char16_t> *this_00;
  uint uVar9;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  
  QDateTime::currentDateTime();
  iVar7 = QDateTime::toSecsSinceEpoch();
  uVar1 = this->m_startTime;
  QDateTime::~QDateTime((QDateTime *)&local_98);
  uVar9 = iVar7 - uVar1;
  if (uVar9 == 0) {
    return;
  }
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  lVar8 = (total - received) / (received / (long)(ulong)uVar9);
  dVar3 = (double)lVar8;
  if (lVar8 < 0x1c21) {
    if (lVar8 < 0x3d) {
      if ((int)(dVar3 + 0.5) < 2) {
        tr((QString *)&local_78,"1 second",(char *)0x0,-1);
        goto LAB_001115ae;
      }
      tr((QString *)&local_58,"%1 seconds",(char *)0x0,-1);
      QString::arg((QString *)&local_78,(QString *)&local_58,(int)(dVar3 + 0.5),0,10,(QChar)0x20);
    }
    else {
      iVar7 = (int)(dVar3 / 60.0 + 0.5);
      if (iVar7 < 2) {
        tr((QString *)&local_78,"1 minute",(char *)0x0,-1);
LAB_001115ae:
        qVar6 = local_98.size;
        pcVar5 = local_98.ptr;
        pDVar4 = local_98.d;
        this_00 = &local_78;
        local_98.d = local_78.d;
        local_98.ptr = local_78.ptr;
        local_78.d = pDVar4;
        local_78.ptr = pcVar5;
        local_98.size = local_78.size;
        local_78.size = qVar6;
        goto LAB_001115d5;
      }
      tr((QString *)&local_58,"%1 minutes",(char *)0x0,-1);
      QString::arg((QString *)&local_78,(QString *)&local_58,iVar7,0,10,(QChar)0x20);
    }
  }
  else {
    iVar7 = (int)(dVar3 / 3600.0 + 0.5);
    if (iVar7 < 2) {
      tr((QString *)&local_78,"about one hour",(char *)0x0,-1);
      goto LAB_001115ae;
    }
    tr((QString *)&local_58,"about %1 hours",(char *)0x0,-1);
    QString::arg((QString *)&local_78,(QString *)&local_58,iVar7,0,10,(QChar)0x20);
  }
  qVar6 = local_98.size;
  pcVar5 = local_98.ptr;
  pDVar4 = local_98.d;
  local_98.d = local_78.d;
  local_98.ptr = local_78.ptr;
  local_78.d = pDVar4;
  local_78.ptr = pcVar5;
  local_98.size = local_78.size;
  local_78.size = qVar6;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  this_00 = &local_58;
LAB_001115d5:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  pQVar2 = (this->m_ui->super_Ui_Downloader).timeLabel;
  tr((QString *)&local_40,"Time remaining",(char *)0x0,-1);
  operator+((QString *)&local_58,(QString *)&local_40,": ");
  operator+((QString *)&local_78,(QString *)&local_58,(QString *)&local_98);
  QLabel::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  return;
}

Assistant:

void Downloader::calculateTimeRemaining(qint64 received, qint64 total)
{
   uint difference = QDateTime::currentDateTime().toSecsSinceEpoch() - m_startTime;

   if (difference > 0)
   {
      QString timeString;
      qreal timeRemaining = (total - received) / (received / difference);

      if (timeRemaining > 7200)
      {
         timeRemaining /= 3600;
         int hours = int(timeRemaining + 0.5);

         if (hours > 1)
            timeString = tr("about %1 hours").arg(hours);
         else
            timeString = tr("about one hour");
      }

      else if (timeRemaining > 60)
      {
         timeRemaining /= 60;
         int minutes = int(timeRemaining + 0.5);

         if (minutes > 1)
            timeString = tr("%1 minutes").arg(minutes);
         else
            timeString = tr("1 minute");
      }

      else if (timeRemaining <= 60)
      {
         int seconds = int(timeRemaining + 0.5);

         if (seconds > 1)
            timeString = tr("%1 seconds").arg(seconds);
         else
            timeString = tr("1 second");
      }

      m_ui->timeLabel->setText(tr("Time remaining") + ": " + timeString);
   }
}